

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O2

void __thiscall QSimplex::~QSimplex(QSimplex *this)

{
  clearDataStructures(this);
  QArrayDataPointer<QSimplexVariable_*>::~QArrayDataPointer(&(this->variables).d);
  QArrayDataPointer<QSimplexConstraint_*>::~QArrayDataPointer
            ((QArrayDataPointer<QSimplexConstraint_*> *)this);
  return;
}

Assistant:

QSimplex::~QSimplex()
{
    clearDataStructures();
}